

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

short __thiscall
mp::internal::TextReader<fmt::Locale>::ReadInt<short>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  short value;
  short local_a;
  
  local_a = 0;
  bVar1 = DoReadOptionalInt<short>(this,&local_a);
  if (!bVar1) {
    ReportError<>(this,(CStringRef)0x12cef8);
  }
  return local_a;
}

Assistant:

Int ReadInt() {
    Int value = 0;
    if (!DoReadOptionalInt(value))
      ReportError("expected integer");
    return value;
  }